

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

Maybe<capnp::schema::Value::Reader> * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::annotationValue<capnp::schema::Node::Reader>
          (Maybe<capnp::schema::Value::Reader> *__return_storage_ptr__,CapnpcCppMain *this,
          Reader proto,uint64_t annotationId)

{
  WirePointer WVar1;
  ElementCount index;
  bool bVar2;
  StructReader local_b0;
  ListReader local_80;
  PointerReader local_50;
  
  if (proto._reader.pointerCount < 3) {
    proto._reader.nestingLimit = 0x7fffffff;
    proto._reader.capTable = (CapTableReader *)0x0;
    local_b0.data = (WirePointer *)0x0;
    proto._reader.segment = (SegmentReader *)0x0;
  }
  else {
    local_b0.data = proto._reader.pointers + 2;
  }
  index = 0;
  local_b0.segment = proto._reader.segment;
  local_b0.capTable = proto._reader.capTable;
  local_b0.pointers._0_4_ = proto._reader.nestingLimit;
  _::PointerReader::getList(&local_80,(PointerReader *)&local_b0,INLINE_COMPOSITE,(word *)0x0);
  bVar2 = local_80.elementCount == 0;
  if (!bVar2) {
    do {
      _::ListReader::getStructElement(&local_b0,&local_80,index);
      if (local_b0.dataSize < 0x40) {
        WVar1.offsetAndKind.value = 0;
        WVar1.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      }
      else {
        WVar1 = *local_b0.data;
      }
      if (WVar1 == (WirePointer)this) {
        if (local_b0.pointerCount == 0) {
          local_b0.nestingLimit = 0x7fffffff;
          local_50.capTable = (CapTableReader *)0x0;
          local_50.pointer = (WirePointer *)0x0;
          local_50.segment = (SegmentReader *)0x0;
        }
        else {
          local_50.pointer = (WirePointer *)CONCAT44(local_b0.pointers._4_4_,(int)local_b0.pointers)
          ;
          local_50.capTable = local_b0.capTable;
          local_50.segment = local_b0.segment;
        }
        local_50.nestingLimit = local_b0.nestingLimit;
        _::PointerReader::getStruct
                  (&(__return_storage_ptr__->ptr).field_1.value._reader,&local_50,(word *)0x0);
        (__return_storage_ptr__->ptr).isSet = true;
        if (!bVar2) {
          return __return_storage_ptr__;
        }
        break;
      }
      index = index + 1;
      bVar2 = local_80.elementCount == index;
    } while (!bVar2);
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<schema::Value::Reader> annotationValue(P proto, uint64_t annotationId) {
    for (auto annotation: proto.getAnnotations()) {
      if (annotation.getId() == annotationId) {
        return annotation.getValue();
      }
    }
    return nullptr;
  }